

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CBufferMap<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferMap<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  DILogger *pDVar7;
  uint in_R9D;
  uint sizeX;
  CDataArray dataRef;
  DIResult result;
  uint in_stack_ffffffffffffedb0;
  _func_int **data;
  undefined1 local_1230 [384];
  undefined1 local_10b0 [384];
  long local_f30;
  DILogger local_f28;
  DILogger local_da8;
  DILogger local_c28;
  DILogger local_aa8;
  DILogger local_928;
  DILogger local_7a8;
  DILogger local_628;
  DILogger local_4a8;
  DILogger local_328;
  DILogger local_1a8;
  
  local_10b0[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_10b0 + 8));
  local_f30 = 0;
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  data = (_func_int **)0x0;
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar6 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar2) < 0x4000) {
    uVar6 = *(uint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  sizeX = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  uVar3 = (uint)(0x10000 / (long)(int)uVar6);
  if ((int)uVar3 < (int)sizeX) {
    sizeX = uVar3;
  }
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&stack0xffffffffffffedb8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,sizeX,0x1e,0x32,
             in_R9D);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,-(long)data,data,0x88e8);
  lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1a8,(DIResult *)local_10b0,lVar4);
  DILogger::~DILogger(&local_1a8);
  pvVar5 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,35000);
  if (pvVar5 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [65])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL");
    pDVar7 = (DILogger *)local_1230;
  }
  else {
    lVar4 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,sizeX
                       ,(uint)pvVar5,(void *)(ulong)uVar6,sizeX,0,in_stack_ffffffffffffedb0,
                       (uint)data);
    DIResult::sub_result(&local_328,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_328);
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,-(long)data);
    DIResult::sub_result(&local_4a8,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_4a8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_628,(DIResult *)local_10b0,lVar4);
    pDVar7 = &local_628;
  }
  DILogger::~DILogger(pDVar7);
  pvVar5 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,0x88b9);
  if (pvVar5 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL");
    pDVar7 = (DILogger *)local_1230;
  }
  else {
    lVar4 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,sizeX
                       ,(uint)pvVar5,(void *)(ulong)uVar6,sizeX,0,in_stack_ffffffffffffedb0,
                       (uint)data);
    DIResult::sub_result(&local_7a8,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_7a8);
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,-(long)data);
    DIResult::sub_result(&local_928,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_928);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 != '\x01') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_aa8,(DIResult *)local_10b0,lVar4);
    pDVar7 = &local_aa8;
  }
  DILogger::~DILogger(pDVar7);
  pvVar5 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,0x88ba);
  if (pvVar5 == (void *)0x0) {
    local_f30 = -1;
    local_1230[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_1230,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL");
    pDVar7 = (DILogger *)local_1230;
  }
  else {
    lVar4 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&stack0xffffffffffffedb8,(CDataArray *)(ulong)uVar6,sizeX
                       ,(uint)pvVar5,(void *)(ulong)uVar6,sizeX,0,in_stack_ffffffffffffedb0,
                       (uint)data);
    DIResult::sub_result(&local_c28,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_c28);
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88ba,3,0,-(long)data);
    DIResult::sub_result(&local_da8,(DIResult *)local_10b0,lVar4);
    DILogger::~DILogger(&local_da8);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_f30 = -1;
      local_1230[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1230 + 8));
      if (local_1230[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1230 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_1230);
    }
    lVar4 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_f28,(DIResult *)local_10b0,lVar4);
    pDVar7 = &local_f28;
  }
  DILogger::~DILogger(pDVar7);
  lVar4 = local_f30;
  if (data != (_func_int **)0x0) {
    operator_delete(data,-(long)data);
  }
  DILogger::~DILogger((DILogger *)local_10b0);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		api::GL_Only();

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) != GL_TRUE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_WRITE, GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}